

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVector.h
# Opt level: O3

void __thiscall chrono::ChForce::SetDir(ChForce *this,ChVector<double> *newf)

{
  double dVar1;
  undefined1 auVar2 [16];
  ChBody *pCVar3;
  double dVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  dVar1 = newf->m_data[1];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = newf->m_data[0];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = newf->m_data[2];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar1 * dVar1;
  auVar5 = vfmadd231sd_fma(auVar15,auVar11,auVar11);
  auVar5 = vfmadd231sd_fma(auVar5,auVar9,auVar9);
  auVar5 = vsqrtsd_avx(auVar5,auVar5);
  bVar6 = 2.2250738585072014e-308 <= auVar5._0_8_;
  dVar14 = 1.0 / auVar5._0_8_;
  dVar4 = (double)((ulong)bVar6 * (long)(newf->m_data[2] * dVar14));
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar4;
  auVar8._0_8_ = (double)((ulong)bVar6 * (long)(newf->m_data[0] * dVar14) +
                         (ulong)!bVar6 * 0x3ff0000000000000);
  auVar8._8_8_ = 0x3ff0000000000000;
  dVar1 = (double)((ulong)bVar6 * (long)(dVar1 * dVar14));
  (this->vdir).m_data[0] = auVar8._0_8_;
  (this->vdir).m_data[1] = dVar1;
  (this->vdir).m_data[2] = dVar4;
  auVar16._8_8_ = auVar8._0_8_;
  auVar16._0_8_ = auVar8._0_8_;
  pCVar3 = this->Body;
  auVar13._0_8_ =
       dVar1 * *(double *)
                ((long)&(pCVar3->super_ChBodyFrame).super_ChFrameMoving<double>.
                        super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage +
                0x18);
  auVar13._8_8_ =
       dVar1 * *(double *)
                ((long)&(pCVar3->super_ChBodyFrame).super_ChFrameMoving<double>.
                        super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage +
                0x20);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(double *)
                  ((long)&(pCVar3->super_ChBodyFrame).super_ChFrameMoving<double>.
                          super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage +
                  0x10);
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       dVar1 * *(double *)
                ((long)&(pCVar3->super_ChBodyFrame).super_ChFrameMoving<double>.
                        super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage +
                0x28);
  auVar8 = vfmadd231sd_fma(auVar12,auVar8,auVar5);
  auVar5 = vfmadd132pd_fma(auVar16,auVar13,
                           *(undefined1 (*) [16])
                            (pCVar3->super_ChBodyFrame).super_ChFrameMoving<double>.
                            super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(double *)
                  ((long)&(pCVar3->super_ChBodyFrame).super_ChFrameMoving<double>.
                          super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage +
                  0x40);
  auVar2 = vfmadd231sd_fma(auVar8,auVar7,auVar2);
  auVar10._8_8_ = dVar4;
  auVar10._0_8_ = dVar4;
  auVar5 = vfmadd132pd_fma(auVar10,auVar5,
                           *(undefined1 (*) [16])
                            ((long)&(pCVar3->super_ChBodyFrame).super_ChFrameMoving<double>.
                                    super_ChFrame<double>.Amatrix.
                                    super_Matrix<double,_3,_3,_1,_3,_3>.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                    m_storage + 0x30));
  *(undefined1 (*) [16])(this->vreldir).m_data = auVar5;
  (this->vreldir).m_data[2] = auVar2._0_8_;
  UpdateState(this);
  return;
}

Assistant:

inline ChVector<Real>::ChVector(const ChVector<Real>& other) {
    m_data[0] = other.m_data[0];
    m_data[1] = other.m_data[1];
    m_data[2] = other.m_data[2];
}